

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand.h
# Opt level: O0

hand * __thiscall hand::printHand_abi_cxx11_(hand *this)

{
  bool bVar1;
  long in_RSI;
  undefined1 local_a0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  reference local_40;
  card *card;
  iterator __end1;
  iterator __begin1;
  vector<card,_std::allocator<card>_> *__range1;
  hand *this_local;
  string *output;
  
  std::__cxx11::string::string((string *)this);
  __end1 = std::vector<card,_std::allocator<card>_>::begin
                     ((vector<card,_std::allocator<card>_> *)(in_RSI + 8));
  card = (card *)std::vector<card,_std::allocator<card>_>::end
                           ((vector<card,_std::allocator<card>_> *)(in_RSI + 8));
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_>
                                     *)&card), bVar1) {
    local_40 = __gnu_cxx::__normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_>::
               operator*(&__end1);
    ::card::getName_abi_cxx11_((card *)local_a0);
    std::operator+(local_a0 + 0x20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10f13d);
    std::operator+(local_60,local_a0 + 0x20);
    std::__cxx11::string::operator+=((string *)this,(string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)(local_a0 + 0x20));
    std::__cxx11::string::~string((string *)local_a0);
    __gnu_cxx::__normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_>::operator++
              (&__end1);
  }
  return this;
}

Assistant:

string hand::printHand() {
    string output;
    for (auto &card : hand_) output += "[" + card.getName() + "] ";
    return output;
}